

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void parasail_matrix_free(parasail_matrix_t *matrix)

{
  parasail_matrix_t *matrix_local;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_matrix_free","matrix");
  }
  else if (matrix->user_matrix == (int *)0x0) {
    fprintf(_stderr,"%s: attempted to free built-in matrix \'%s\'\n","parasail_matrix_free",
            matrix->name);
  }
  else {
    free(matrix->matrix);
    free(matrix->mapper);
    free(matrix->alphabet);
    if (matrix->query != (char *)0x0) {
      free(matrix->query);
    }
    free(matrix);
  }
  return;
}

Assistant:

void parasail_matrix_free(parasail_matrix_t *matrix)
{
    /* validate inputs */
    PARASAIL_CHECK_NULL_NORETVAL(matrix);

    if (NULL != matrix->user_matrix) {
        free((void*)matrix->matrix);
        free((void*)matrix->mapper);
        free((void*)matrix->alphabet);
        if (matrix->query) free((void*)matrix->query);
        free(matrix);
    }
    else {
        fprintf(stderr, "%s: attempted to free built-in matrix '%s'\n",
                __func__, matrix->name);
    }
}